

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

size_t __thiscall
anon_unknown.dwarf_3e90a3a::ConstPubkeyProvider::GetSize(ConstPubkeyProvider *this)

{
  byte bVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  bVar1 = (this->super_PubkeyProvider).field_0xc;
  if ((bVar1 & 0xfe) == 2) {
    sVar2 = 0x21;
  }
  else {
    bVar1 = bVar1 - 4;
    if (bVar1 < 4) {
      sVar2 = *(size_t *)(&DAT_00b70b20 + (ulong)bVar1 * 8);
    }
    else {
      sVar2 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetSize() const override { return m_pubkey.size(); }